

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_SubcommandDefaults_Test::TApp_SubcommandDefaults_Test(TApp_SubcommandDefaults_Test *this)

{
  TApp_SubcommandDefaults_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_SubcommandDefaults_Test_001c01d8;
  return;
}

Assistant:

TEST_F(TApp, SubcommandDefaults) {
    // allow_extras, prefix_command, ignore_case, fallthrough, group, min/max subcommand

    // Initial defaults
    EXPECT_FALSE(app.get_allow_extras());
    EXPECT_FALSE(app.get_prefix_command());
    EXPECT_FALSE(app.get_ignore_case());
    EXPECT_FALSE(app.get_fallthrough());
    EXPECT_EQ(app.get_footer(), "");
    EXPECT_EQ(app.get_group(), "Subcommands");
    EXPECT_EQ(app.get_require_subcommand_min(), (size_t)0);
    EXPECT_EQ(app.get_require_subcommand_max(), (size_t)0);

    app.allow_extras();
    app.prefix_command();
    app.ignore_case();
    app.fallthrough();
    app.set_footer("footy");
    app.group("Stuff");
    app.require_subcommand(2, 3);

    auto app2 = app.add_subcommand("app2");

    // Initial defaults
    EXPECT_TRUE(app2->get_allow_extras());
    EXPECT_TRUE(app2->get_prefix_command());
    EXPECT_TRUE(app2->get_ignore_case());
    EXPECT_TRUE(app2->get_fallthrough());
    EXPECT_EQ(app2->get_footer(), "footy");
    EXPECT_EQ(app2->get_group(), "Stuff");
    EXPECT_EQ(app2->get_require_subcommand_min(), (size_t)0);
    EXPECT_EQ(app2->get_require_subcommand_max(), (size_t)3);
}